

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

MMAL_PARAM_AWBMODE_T __thiscall
raspicam::_private::Private_Impl::convertAWB(Private_Impl *this,RASPICAM_AWB awb)

{
  RASPICAM_AWB awb_local;
  Private_Impl *this_local;
  MMAL_PARAM_AWBMODE_T local_4;
  
  switch(awb) {
  case RASPICAM_AWB_OFF:
    local_4 = MMAL_PARAM_AWBMODE_OFF;
    break;
  case RASPICAM_AWB_AUTO:
    local_4 = MMAL_PARAM_AWBMODE_AUTO;
    break;
  case RASPICAM_AWB_SUNLIGHT:
    local_4 = MMAL_PARAM_AWBMODE_SUNLIGHT;
    break;
  case RASPICAM_AWB_CLOUDY:
    local_4 = MMAL_PARAM_AWBMODE_CLOUDY;
    break;
  case RASPICAM_AWB_SHADE:
    local_4 = MMAL_PARAM_AWBMODE_SHADE;
    break;
  case RASPICAM_AWB_TUNGSTEN:
    local_4 = MMAL_PARAM_AWBMODE_TUNGSTEN;
    break;
  case RASPICAM_AWB_FLUORESCENT:
    local_4 = MMAL_PARAM_AWBMODE_FLUORESCENT;
    break;
  case RASPICAM_AWB_INCANDESCENT:
    local_4 = MMAL_PARAM_AWBMODE_INCANDESCENT;
    break;
  case RASPICAM_AWB_FLASH:
    local_4 = MMAL_PARAM_AWBMODE_FLASH;
    break;
  case RASPICAM_AWB_HORIZON:
    local_4 = MMAL_PARAM_AWBMODE_HORIZON;
    break;
  default:
    local_4 = MMAL_PARAM_AWBMODE_AUTO;
  }
  return local_4;
}

Assistant:

MMAL_PARAM_AWBMODE_T Private_Impl::convertAWB ( RASPICAM_AWB awb ) {
            switch ( awb ) {
            case RASPICAM_AWB_OFF:
                return MMAL_PARAM_AWBMODE_OFF;
            case RASPICAM_AWB_AUTO:
                return MMAL_PARAM_AWBMODE_AUTO;
            case RASPICAM_AWB_SUNLIGHT:
                return MMAL_PARAM_AWBMODE_SUNLIGHT;
            case RASPICAM_AWB_CLOUDY:
                return MMAL_PARAM_AWBMODE_CLOUDY;
            case RASPICAM_AWB_SHADE:
                return MMAL_PARAM_AWBMODE_SHADE;
            case RASPICAM_AWB_TUNGSTEN:
                return MMAL_PARAM_AWBMODE_TUNGSTEN;
            case RASPICAM_AWB_FLUORESCENT:
                return MMAL_PARAM_AWBMODE_FLUORESCENT;
            case RASPICAM_AWB_INCANDESCENT:
                return MMAL_PARAM_AWBMODE_INCANDESCENT;
            case RASPICAM_AWB_FLASH:
                return MMAL_PARAM_AWBMODE_FLASH;
            case RASPICAM_AWB_HORIZON:
                return MMAL_PARAM_AWBMODE_HORIZON;
            default:
                return MMAL_PARAM_AWBMODE_AUTO;
            }
        }